

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpWithTcpServer::KcpWithTcpServer
          (KcpWithTcpServer *this,KcpTcpEventLoop *loop,InetAddress *listenAddr,
          vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *udpListenAddrs,
          string *nameArg,int kcpMode,Option option)

{
  KcpTcpEventLoop *pKVar1;
  Acceptor *this_00;
  KcpTcpEventLoopThreadPool *this_01;
  pointer this_02;
  undefined4 in_register_0000008c;
  SourceFile file;
  KcpWithTcpServer *local_f8;
  code *local_f0;
  undefined8 local_e8;
  type local_e0;
  NewConnectionCallback local_c8;
  KcpWithTcpServer *local_a8;
  code *local_a0;
  undefined8 local_98;
  type local_90;
  StringMessageCallback local_78;
  SourceFile local_48;
  int local_34;
  string *psStack_30;
  int kcpMode_local;
  string *nameArg_local;
  vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *udpListenAddrs_local;
  InetAddress *listenAddr_local;
  KcpTcpEventLoop *loop_local;
  KcpWithTcpServer *this_local;
  
  pKVar1 = (KcpTcpEventLoop *)CONCAT44(in_register_0000008c,kcpMode);
  local_34 = kcpMode;
  psStack_30 = nameArg;
  nameArg_local = (string *)udpListenAddrs;
  udpListenAddrs_local =
       (vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)listenAddr;
  listenAddr_local = (InetAddress *)loop;
  loop_local = (KcpTcpEventLoop *)this;
  Logger::SourceFile::SourceFile<107>
            (&local_48,
             (char (*) [107])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_48.m_size;
  file._8_8_ = 0x10;
  pKVar1 = CheckNotNull<sznet::net::KcpTcpEventLoop>
                     ((sznet *)local_48.m_data,file,0x1d071d,(char *)listenAddr_local,pKVar1);
  this->m_loop = pKVar1;
  InetAddress::toIpPort_abi_cxx11_((InetAddress *)&this->m_ipPort);
  std::__cxx11::string::string((string *)&this->m_name,(string *)psStack_30);
  this_00 = (Acceptor *)operator_new(0xf0);
  Acceptor::Acceptor(this_00,(EventLoop *)listenAddr_local,(InetAddress *)udpListenAddrs_local,
                     option == kReusePort);
  std::unique_ptr<sznet::net::Acceptor,std::default_delete<sznet::net::Acceptor>>::
  unique_ptr<std::default_delete<sznet::net::Acceptor>,void>
            ((unique_ptr<sznet::net::Acceptor,std::default_delete<sznet::net::Acceptor>> *)
             &this->m_acceptor,this_00);
  this_01 = (KcpTcpEventLoopThreadPool *)operator_new(0x80);
  KcpTcpEventLoopThreadPool::KcpTcpEventLoopThreadPool
            (this_01,(KcpTcpEventLoop *)listenAddr_local,
             (vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)
             nameArg_local,&this->m_name);
  std::shared_ptr<sznet::net::KcpTcpEventLoopThreadPool>::
  shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,void>(&this->m_threadPool,this_01);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::function
            (&this->m_kcpConnectionCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::function(&this->m_kcpMessageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::function
            (&this->m_kcpWriteCompleteCallback);
  std::function<void_(sznet::net::KcpTcpEventLoop_*)>::function(&this->m_threadInitCallback);
  std::atomic<int>::atomic(&this->m_started,0);
  this->m_nextConnId = 1;
  std::
  map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  ::map(&this->m_connections);
  std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::vector
            (&this->m_udpListenAddrs,
             (vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)
             nameArg_local);
  local_a0 = tcpMessage;
  local_98 = 0;
  local_a8 = this;
  std::
  bind<void(sznet::net::KcpWithTcpServer::*)(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp),sznet::net::KcpWithTcpServer*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_90,(offset_in_KcpWithTcpServer_to_subr *)&local_a0,&local_a8,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::
  function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
  ::
  function<std::_Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
              *)&local_78,&local_90);
  LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::LengthHeaderCodec
            (&this->m_tcpCodec,&local_78);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  ::~function(&local_78);
  this->m_kcpMode = local_34;
  this_02 = std::unique_ptr<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>::
            operator->(&this->m_acceptor);
  local_f0 = newConnection;
  local_e8 = 0;
  local_f8 = this;
  std::
  bind<void(sznet::net::KcpWithTcpServer::*)(int,sznet::net::InetAddress_const&),sznet::net::KcpWithTcpServer*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_e0,(offset_in_KcpWithTcpServer_to_subr *)&local_f0,&local_f8,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<void(int,sznet::net::InetAddress_const&)>::
  function<std::_Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::_Placeholder<1>,std::_Placeholder<2>))(int,sznet::net::InetAddress_const&)>,void>
            ((function<void(int,sznet::net::InetAddress_const&)> *)&local_c8,&local_e0);
  Acceptor::setNewConnectionCallback(this_02,&local_c8);
  std::function<void_(int,_const_sznet::net::InetAddress_&)>::~function(&local_c8);
  return;
}

Assistant:

KcpWithTcpServer::KcpWithTcpServer(KcpTcpEventLoop* loop, const InetAddress& listenAddr, const std::vector<InetAddress>& udpListenAddrs, const string& nameArg, int kcpMode, Option option) :
	m_loop(CHECK_NOTNULL(loop)),
	m_ipPort(listenAddr.toIpPort()),
	m_name(nameArg),
	m_acceptor(new Acceptor(loop, listenAddr, option == kReusePort)),
	m_threadPool(new KcpTcpEventLoopThreadPool(loop, udpListenAddrs, m_name)),
	m_started(0),
	m_nextConnId(1),
	m_udpListenAddrs(udpListenAddrs),
	m_tcpCodec(std::bind(&KcpWithTcpServer::tcpMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
	m_kcpMode(kcpMode)
{
	m_acceptor->setNewConnectionCallback(std::bind(&KcpWithTcpServer::newConnection, this, std::placeholders::_1, std::placeholders::_2));
}